

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O3

bool __thiscall draco::CornerTable::Reset(CornerTable *this,int num_faces,int num_vertices)

{
  pointer piVar1;
  pointer piVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  
  bVar5 = -1 < (num_vertices | num_faces);
  if ((uint)num_faces < 0x55555556 && bVar5) {
    std::
    vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
    ::_M_fill_assign((vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      *)this,(ulong)(uint)(num_faces * 3),(value_type *)&kInvalidVertexIndex);
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::_M_fill_assign(&(this->opposite_corners_).vector_,(ulong)(uint)(num_faces * 3),
                     (value_type *)&kInvalidCornerIndex);
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::reserve(&(this->vertex_corners_).vector_,(ulong)(uint)num_vertices);
    piVar1 = (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar2 = (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
         = (pointer)0x0;
    if (piVar1 != (pointer)0x0) {
      operator_delete(piVar1,(long)piVar2 - (long)piVar1);
    }
    pcVar3 = (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar4 = (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pcVar3 != (pointer)0x0) {
      operator_delete(pcVar3,(long)pcVar4 - (long)pcVar3);
    }
  }
  return (uint)num_faces < 0x55555556 && bVar5;
}

Assistant:

bool CornerTable::Reset(int num_faces, int num_vertices) {
  if (num_faces < 0 || num_vertices < 0) {
    return false;
  }
  const unsigned int num_faces_unsigned = num_faces;
  if (num_faces_unsigned >
      std::numeric_limits<CornerIndex::ValueType>::max() / 3) {
    return false;
  }
  corner_to_vertex_map_.assign(num_faces_unsigned * 3, kInvalidVertexIndex);
  opposite_corners_.assign(num_faces_unsigned * 3, kInvalidCornerIndex);
  vertex_corners_.reserve(num_vertices);
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();
  return true;
}